

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcc.hpp
# Opt level: O2

void * __thiscall cppjit::builder::gcc::compile_impl(gcc *this)

{
  string *__rhs;
  string *__lhs;
  int iVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  cppjit_exception *pcVar6;
  string link_cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  string compile_cmd;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  string object_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  string library_file;
  string source_file;
  ofstream kernel_header_file;
  
  __rhs = &(this->super_builder).kernel_name;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,&(this->super_builder).source_dir,__rhs);
  std::operator+(&source_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,".cpp");
  std::__cxx11::string::~string((string *)&kernel_header_file);
  __lhs = &(this->super_builder).compile_dir;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,__lhs,__rhs);
  std::operator+(&object_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,".o");
  std::__cxx11::string::~string((string *)&kernel_header_file);
  std::operator+(&compile_cmd,__lhs,"lib");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,&compile_cmd,__rhs);
  std::operator+(&library_file,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,".so");
  std::__cxx11::string::~string((string *)&kernel_header_file);
  std::__cxx11::string::~string((string *)&compile_cmd);
  std::operator+(&local_430,&this->compiler," -o ");
  std::operator+(&local_410,&local_430,&object_file);
  std::operator+(&local_3f0,&local_410," -c ");
  std::operator+(&local_3d0,&local_3f0,&this->cpp_flags);
  std::operator+(&local_3b0,&local_3d0," ");
  std::operator+(&local_390,&local_3b0,&this->include_paths);
  std::operator+(&local_370,&local_390," -I");
  std::operator+(&local_350,&local_370,__lhs);
  std::operator+(&local_330,&local_350," ");
  std::operator+(&local_310,&local_330,&source_file);
  std::operator+(&local_470,&local_310," ");
  std::operator+(&local_490,&local_470," > ");
  std::operator+(&link_cmd,&local_490,__lhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,&link_cmd,__rhs);
  std::operator+(&compile_cmd,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &kernel_header_file,"_compile.log 2>&1");
  std::__cxx11::string::~string((string *)&kernel_header_file);
  std::__cxx11::string::~string((string *)&link_cmd);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  if ((this->super_builder).verbose == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"creating per-kernel header");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::operator+(&link_cmd,__lhs,"cppjit_kernel.hpp");
  std::ofstream::ofstream(&kernel_header_file,(string *)&link_cmd,_S_out);
  std::__cxx11::string::~string((string *)&link_cmd);
  poVar2 = std::operator<<((ostream *)&kernel_header_file,"#pragma once");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&kernel_header_file,"#define CPPJIT_EXPORT extern \"C\"");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::close();
  if ((this->super_builder).verbose == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"compile_cmd: ");
    poVar2 = std::operator<<(poVar2,(string *)&compile_cmd);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  iVar1 = system(compile_cmd._M_dataplus._M_p);
  if ((this->super_builder).verbose == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"compile log:");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator+(&link_cmd,__lhs,__rhs);
    std::operator+(&local_290,&link_cmd,"_compile.log");
    builder::read_and_print_log(&this->super_builder,&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&link_cmd);
  }
  if (iVar1 != 0) {
    pcVar6 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&link_cmd,"error: compilation of kernel failed",(allocator *)&local_490);
    cppjit_exception::cppjit_exception(pcVar6,&link_cmd);
    __cxa_throw(pcVar6,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  if ((this->super_builder).verbose == true) {
    std::operator<<((ostream *)&std::cout,"compile duration: ");
    poVar2 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  std::operator+(&local_2b0,&this->linker," ");
  std::operator+(&local_430,&local_2b0,&this->link_flags);
  std::operator+(&local_410,&local_430," -o ");
  std::operator+(&local_3f0,&local_410,&library_file);
  std::operator+(&local_3d0,&local_3f0," ");
  std::operator+(&local_3b0,&local_3d0,&object_file);
  std::operator+(&local_390,&local_3b0," ");
  std::operator+(&local_370,&local_390,&this->library_paths);
  std::operator+(&local_350,&local_370," ");
  std::operator+(&local_330,&local_350,&this->libraries);
  std::operator+(&local_310,&local_330," > ");
  std::operator+(&local_470,&local_310,__lhs);
  std::operator+(&local_490,&local_470,__rhs);
  std::operator+(&link_cmd,&local_490,"_link.log 2>&1");
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_2b0);
  if ((this->super_builder).verbose == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"link_cmd: ");
    poVar2 = std::operator<<(poVar2,(string *)&link_cmd);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  lVar3 = std::chrono::_V2::system_clock::now();
  iVar1 = system(link_cmd._M_dataplus._M_p);
  if ((this->super_builder).verbose == true) {
    poVar2 = std::operator<<((ostream *)&std::cout,"link log:");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator+(&local_490,__lhs,__rhs);
    std::operator+(&local_2d0,&local_490,"_link.log");
    builder::read_and_print_log(&this->super_builder,&local_2d0);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_490);
  }
  if (iVar1 == 0) {
    lVar4 = std::chrono::_V2::system_clock::now();
    if ((this->super_builder).verbose == true) {
      std::operator<<((ostream *)&std::cout,"link duration: ");
      poVar2 = std::ostream::_M_insert<double>((double)(lVar4 - lVar3) / 1000000000.0);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    pvVar5 = builder::load_kernel(&this->super_builder);
    std::__cxx11::string::~string((string *)&link_cmd);
    std::ofstream::~ofstream(&kernel_header_file);
    std::__cxx11::string::~string((string *)&compile_cmd);
    std::__cxx11::string::~string((string *)&library_file);
    std::__cxx11::string::~string((string *)&object_file);
    std::__cxx11::string::~string((string *)&source_file);
    return pvVar5;
  }
  pcVar6 = (cppjit_exception *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_490,"error: compile of kernel failed",(allocator *)&local_470);
  cppjit_exception::cppjit_exception(pcVar6,&local_490);
  __cxa_throw(pcVar6,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
}

Assistant:

void *compile_impl() override {
    // std::string kernel_source_dir = kernel_compile_dir;
    std::string source_file(source_dir + kernel_name + ".cpp");
    std::string object_file(compile_dir + kernel_name + ".o");
    std::string library_file(compile_dir + "lib" + kernel_name + ".so");
    // add compile dir as special include path for dynamically generated headers
    std::string compile_cmd(compiler + " -o " + object_file + " -c " +
                            cpp_flags + " " + include_paths + " -I" +
                            compile_dir + " " + source_file + " " +
                            " > " +
                            compile_dir + kernel_name + "_compile.log 2>&1");

    if (verbose) {
      std::cout << "creating per-kernel header" << std::endl;
    }

    std::ofstream kernel_header_file(compile_dir + "cppjit_kernel.hpp");
    kernel_header_file << "#pragma once" << std::endl;
    kernel_header_file << "#define CPPJIT_EXPORT extern \"C\"" << std::endl;
    kernel_header_file.close();

    if (verbose) {
      std::cout << "compile_cmd: " << compile_cmd << std::endl;
    }
    std::chrono::high_resolution_clock::time_point compile_start =
        std::chrono::high_resolution_clock::now();
    int return_value = std::system(compile_cmd.c_str());
    if (verbose) {
      std::cout << "compile log:" << std::endl;
      read_and_print_log(compile_dir + kernel_name + "_compile.log");
    }
    if (return_value != 0) {
      throw cppjit_exception("error: compilation of kernel failed");
    }

    std::chrono::high_resolution_clock::time_point compile_end =
        std::chrono::high_resolution_clock::now();
    double compile_duration =
        std::chrono::duration<double>(compile_end - compile_start).count();
    if (verbose) {
      std::cout << "compile duration: " << compile_duration << std::endl;
    }

    std::string link_cmd(linker + " " + link_flags + " -o " + library_file +
                         " " + object_file + " " + library_paths + " " + libraries + " > " + compile_dir + kernel_name +
                         "_link.log 2>&1");
    if (verbose) {
      std::cout << "link_cmd: " << link_cmd << std::endl;
    }
    std::chrono::high_resolution_clock::time_point link_start =
        std::chrono::high_resolution_clock::now();
    return_value = std::system(link_cmd.c_str());
    if (verbose) {
      std::cout << "link log:" << std::endl;
      read_and_print_log(compile_dir + kernel_name + "_link.log");
    }
    if (return_value != 0) {
      throw cppjit_exception("error: compile of kernel failed");
    }
    std::chrono::high_resolution_clock::time_point link_end =
        std::chrono::high_resolution_clock::now();
    double link_duration =
        std::chrono::duration<double>(link_end - link_start).count();
    if (verbose) {
      std::cout << "link duration: " << link_duration << std::endl;
    }
    return this->load_kernel();
  }